

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int sftp_packet_requirev
              (LIBSSH2_SFTP *sftp,int num_valid_responses,uchar *valid_responses,uint32_t request_id
              ,uchar **data,size_t *data_len,size_t required_size)

{
  int iVar1;
  time_t tVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  undefined4 in_register_00000034;
  bool bVar4;
  int local_40;
  
  iVar1 = -0x27;
  if (data != (uchar **)0x0 && (uchar **)CONCAT44(in_register_0000000c,request_id) != (uchar **)0x0)
  {
    if (sftp->requirev_start == 0) {
      tVar2 = time((time_t *)0x0);
      sftp->requirev_start = tVar2;
    }
    iVar1 = sftp->channel->session->socket_state;
    while (iVar1 == 0) {
      lVar3 = 0;
      do {
        iVar1 = sftp_packet_ask(sftp,*(uchar *)(CONCAT44(in_register_00000034,num_valid_responses) +
                                               lVar3),(uint32_t)valid_responses,
                                (uchar **)CONCAT44(in_register_0000000c,request_id),(size_t *)data);
        if (iVar1 == 0) {
          sftp->requirev_start = 0;
          if (*data < data_len) {
            return -0x26;
          }
          return 0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      iVar1 = sftp_packet_read(sftp);
      if (iVar1 != -0x25 && iVar1 < 0) {
        sftp->requirev_start = 0;
        return iVar1;
      }
      if (iVar1 < 1) {
        lVar3 = sftp->channel->session->packet_read_timeout;
        tVar2 = time((time_t *)0x0);
        if ((lVar3 - tVar2) + sftp->requirev_start < 1) {
          sftp->requirev_start = 0;
          local_40 = -9;
          bVar4 = false;
        }
        else {
          bVar4 = iVar1 != -0x25;
          if (!bVar4) {
            local_40 = -0x25;
          }
        }
        if (!bVar4) {
          return local_40;
        }
      }
      iVar1 = sftp->channel->session->socket_state;
    }
    sftp->requirev_start = 0;
    iVar1 = -0xd;
  }
  return iVar1;
}

Assistant:

static int
sftp_packet_requirev(LIBSSH2_SFTP *sftp, int num_valid_responses,
                     const unsigned char *valid_responses,
                     uint32_t request_id, unsigned char **data,
                     size_t *data_len, size_t required_size)
{
    int i;
    int rc;

    if(!data || !data_len || required_size == 0) {
        return LIBSSH2_ERROR_BAD_USE;
    }

    /* If no timeout is active, start a new one */
    if(sftp->requirev_start == 0)
        sftp->requirev_start = time(NULL);

    while(sftp->channel->session->socket_state == LIBSSH2_SOCKET_CONNECTED) {
        for(i = 0; i < num_valid_responses; i++) {
            if(sftp_packet_ask(sftp, valid_responses[i], request_id,
                               data, data_len) == 0) {
                /*
                 * Set to zero before all returns to say
                 * the timeout is not active
                 */
                sftp->requirev_start = 0;

                if(*data_len < required_size) {
                    return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
                }

                return LIBSSH2_ERROR_NONE;
            }
        }

        rc = sftp_packet_read(sftp);
        if((rc < 0) && (rc != LIBSSH2_ERROR_EAGAIN)) {
            sftp->requirev_start = 0;
            return rc;
        }
        else if(rc <= 0) {
            /* prevent busy-looping */
            long left =
                sftp->channel->session->packet_read_timeout -
                (long)(time(NULL) - sftp->requirev_start);

            if(left <= 0) {
                sftp->requirev_start = 0;
                return LIBSSH2_ERROR_TIMEOUT;
            }
            else if(rc == LIBSSH2_ERROR_EAGAIN) {
                return rc;
            }
        }
    }

    sftp->requirev_start = 0;

    /* Only reached if the socket died */
    return LIBSSH2_ERROR_SOCKET_DISCONNECT;
}